

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpiabi_defn_functions_c.h
# Opt level: O0

int MPIABI_Status_set_cancelled(MPIABI_Status *status,int flag)

{
  int iVar1;
  MPI_Status *pMVar2;
  WPI_StatusPtr local_20;
  int local_14;
  MPIABI_Status *pMStack_10;
  int flag_local;
  MPIABI_Status *status_local;
  
  local_14 = flag;
  pMStack_10 = status;
  WPI_StatusPtr::WPI_StatusPtr(&local_20,status);
  pMVar2 = WPI_StatusPtr::operator_cast_to_ompi_status_public_t_(&local_20);
  iVar1 = MPI_Status_set_cancelled(pMVar2,local_14);
  WPI_StatusPtr::~WPI_StatusPtr(&local_20);
  return iVar1;
}

Assistant:

int MPIABI_Status_set_cancelled(
  MPIABI_Status * status,
  int flag
) {
  return MPI_Status_set_cancelled(
    (MPI_Status *)(WPI_StatusPtr)status,
    flag
  );
}